

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,size_type n)

{
  size_t sVar1;
  iterator piVar2;
  ulong in_RSI;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_RDI;
  size_t i_1;
  size_t i;
  ulong n_00;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_stack_ffffffffffffffe0;
  ulong local_18;
  
  n_00 = in_RSI;
  sVar1 = size(in_RDI);
  local_18 = in_RSI;
  if (n_00 < sVar1) {
    while (sVar1 = size(in_RDI), in_RSI < sVar1) {
      piVar2 = begin(in_RDI);
      pstd::pmr::polymorphic_allocator<int>::destroy<int>(&in_RDI->alloc,piVar2 + local_18);
      local_18 = local_18 + 1;
    }
  }
  else {
    sVar1 = size(in_RDI);
    if (sVar1 < in_RSI) {
      reserve(in_stack_ffffffffffffffe0,n_00);
      for (sVar1 = in_RDI->nStored; sVar1 < in_RSI; sVar1 = sVar1 + 1) {
        piVar2 = begin(in_RDI);
        pstd::pmr::polymorphic_allocator<int>::construct<int>(&in_RDI->alloc,piVar2 + sVar1);
      }
    }
  }
  in_RDI->nStored = in_RSI;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; n < size(); ++i)
                alloc.destroy(begin() + i);
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(begin() + i);
        }
        nStored = n;
    }